

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

int fminunc(custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,double maxstep,
           int method,double *xf)

{
  int iVar1;
  double *dx_00;
  double __x;
  double dVar2;
  double *dx;
  double delta;
  double xtol;
  double ftol;
  double stol;
  double gtol;
  double eps;
  double fsval;
  int local_50;
  int m;
  int niter;
  int MAXITER;
  int retval;
  int i;
  double *xf_local;
  double dStack_30;
  int method_local;
  double maxstep_local;
  double *xi_local;
  custom_gradient *pcStack_18;
  int N_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  _retval = xf;
  xf_local._4_4_ = method;
  dStack_30 = maxstep;
  maxstep_local = (double)xi;
  xi_local._4_4_ = N;
  pcStack_18 = funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  dx_00 = (double *)malloc((long)N << 3);
  m = xi_local._4_4_ * 200;
  local_50 = 0;
  __x = macheps();
  for (MAXITER = 0; MAXITER < xi_local._4_4_; MAXITER = MAXITER + 1) {
    dx_00[MAXITER] = 1.0;
  }
  if (xf_local._4_4_ == 0) {
    niter = nel_min((custom_function *)funcgrad_local,(double *)maxstep_local,xi_local._4_4_,dx_00,
                    1.0,m,&local_50,__x,_retval);
  }
  else if (xf_local._4_4_ == 1) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    niter = newton_min_func((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                            xi_local._4_4_,dx_00,1.0,dStack_30,m,&local_50,__x,dVar2,dVar2 * dVar2,
                            _retval);
  }
  else if (xf_local._4_4_ == 2) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    niter = newton_min_trust((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                             xi_local._4_4_,dx_00,1.0,-1.0,0,m,&local_50,__x,dVar2,dVar2 * dVar2,
                             _retval);
  }
  else if (xf_local._4_4_ == 3) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    niter = newton_min_trust((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                             xi_local._4_4_,dx_00,1.0,-1.0,1,m,&local_50,__x,dVar2,dVar2 * dVar2,
                             _retval);
  }
  else if (xf_local._4_4_ == 4) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    niter = conjgrad_min_lin((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                             xi_local._4_4_,dx_00,dStack_30,m,&local_50,__x,dVar2,dVar2 * dVar2,__x,
                             _retval);
  }
  else if (xf_local._4_4_ == 5) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    niter = bfgs_min((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                     xi_local._4_4_,dx_00,1.0,dStack_30,m,&local_50,__x,dVar2,dVar2 * dVar2,_retval)
    ;
  }
  else if (xf_local._4_4_ == 6) {
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    iVar1 = mvalue(xi_local._4_4_);
    niter = bfgs_l_min((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                       xi_local._4_4_,iVar1,dx_00,1.0,dStack_30,m,&local_50,__x,dVar2,dVar2 * dVar2,
                       __x,_retval);
  }
  else {
    if (xf_local._4_4_ != 7) {
      printf("Method Value should be one of 0,1,2,3,4,5,6 or 7. See Documentation. \n");
      exit(1);
    }
    dVar2 = pow(__x,0.3333333333333333);
    if (m < 1000) {
      m = 1000;
    }
    iVar1 = mvalue(xi_local._4_4_);
    niter = bfgs_min2((custom_function *)funcgrad_local,pcStack_18,(double *)maxstep_local,
                      xi_local._4_4_,iVar1,dx_00,1.0,dStack_30,m,&local_50,__x,dVar2,dVar2 * dVar2,
                      __x,_retval);
  }
  free(dx_00);
  return niter;
}

Assistant:

int fminunc(custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,double maxstep, int method,double *xf) {
	int i,retval,MAXITER,niter,m;
	double fsval,eps,gtol,stol,ftol,xtol,delta;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);
		/*
		 * Method 0 - Nelder-Mead
		 * Method 1 - Newton Line Search
		 * Method 2 - Newton Trust Region - Hook Step
		 * Method 3 - Newton Trust Region - Double Dog-Leg
		 * Method 4 - Conjugate Gradient
		 * Method 5 - BFGS
		 * Method 6 - Limited Memory BFGS
		 * Method 7 - BFGS More-Thuente Line Search
		 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occured.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */
	fsval = 1.0;
	MAXITER = 200*N;
	niter = 0;
	delta = -1.0; // Trust Region default
	eps = macheps(); // Use macheps program

	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}

	if (method == 0) {
		retval = nel_min(funcpt,xi,N,dx,fsval,MAXITER,&niter,eps,xf);
	} else if (method == 1) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_func(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 2) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,0,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 3) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,1,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 4) {
		gtol = pow(eps,1.0/3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = conjgrad_min_lin(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,&niter,eps,gtol,ftol,xtol,xf);
	} else if (method == 5) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = bfgs_min(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 6) {
		gtol = pow(eps,1.0/3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		m = mvalue(N);
		retval = bfgs_l_min(funcpt,funcgrad,xi,N,m,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,ftol,xtol,xf);
	}
	else if (method == 7) {
		gtol = pow(eps, 1.0 / 3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		m = mvalue(N);
		retval = bfgs_min2(funcpt, funcgrad, xi, N, m, dx, fsval, maxstep, MAXITER, &niter, eps, gtol, ftol, xtol, xf);
	}
	else {
		printf("Method Value should be one of 0,1,2,3,4,5,6 or 7. See Documentation. \n");
		exit(1);
	}



	free(dx);
	return retval;
}